

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long> absl::lts_20250127::PowFive(uint64_t num,int expfive)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  type tVar2;
  byte bVar3;
  uint32_t mul;
  undefined8 in_RCX;
  pair<unsigned_long,_unsigned_long> num_00;
  pair<unsigned_long,_unsigned_long> num_01;
  int shift;
  pair<unsigned_long,_unsigned_long> local_98;
  undefined4 local_88 [2];
  uint32_t powers_of_five [13];
  pair<unsigned_long,_unsigned_long> local_38;
  int local_28;
  uint local_24;
  uint64_t uStack_20;
  int expfive_local;
  uint64_t num_local;
  pair<unsigned_long,_unsigned_long> result;
  
  local_28 = 0;
  local_24 = expfive;
  uStack_20 = num;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_int,_true>
            ((pair<unsigned_long,_unsigned_long> *)&num_local,&stack0xffffffffffffffe0,&local_28);
  for (; mul = (uint32_t)in_RCX, 0xc < (int)local_24; local_24 = local_24 - 0xd) {
    num_00.second = 0x48c27395;
    num_00.first = result.first;
    local_38 = Mul32((lts_20250127 *)num_local,num_00,mul);
    std::pair<unsigned_long,_unsigned_long>::operator=
              ((pair<unsigned_long,_unsigned_long> *)&num_local,&local_38);
  }
  memcpy(local_88,&DAT_0081ddc0,0x34);
  num_01.second._0_4_ = powers_of_five[(long)(int)(local_24 & 0xf) + -2];
  num_01.first = result.first;
  num_01.second._4_4_ = 0;
  local_98 = Mul32((lts_20250127 *)num_local,num_01,mul);
  std::pair<unsigned_long,_unsigned_long>::operator=
            ((pair<unsigned_long,_unsigned_long> *)&num_local,&local_98);
  tVar2 = countl_zero<unsigned_long>(num_local);
  if (tVar2 != 0) {
    bVar3 = (byte)tVar2;
    num_local = (num_local << (bVar3 & 0x3f)) + (result.first >> (0x40 - bVar3 & 0x3f));
    result.first = result.first << (bVar3 & 0x3f);
  }
  pVar1.second = result.first;
  pVar1.first = num_local;
  return pVar1;
}

Assistant:

static std::pair<uint64_t, uint64_t> PowFive(uint64_t num, int expfive) {
  std::pair<uint64_t, uint64_t> result = {num, 0};
  while (expfive >= 13) {
    // 5^13 is the highest power of five that will fit in a 32-bit integer.
    result = Mul32(result, 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5);
    expfive -= 13;
  }
  constexpr uint32_t powers_of_five[13] = {
      1,
      5,
      5 * 5,
      5 * 5 * 5,
      5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5};
  result = Mul32(result, powers_of_five[expfive & 15]);
  int shift = countl_zero(result.first);
  if (shift != 0) {
    result.first = (result.first << shift) + (result.second >> (64 - shift));
    result.second = (result.second << shift);
  }
  return result;
}